

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O0

void __thiscall cppcms::plugin::manager::manager(manager *this)

{
  _data *this_00;
  hold_ptr<cppcms::plugin::manager::_data> *in_RDI;
  
  this_00 = (_data *)operator_new(0x58);
  memset(this_00,0,0x58);
  _data::_data(this_00);
  booster::hold_ptr<cppcms::plugin::manager::_data>::hold_ptr(in_RDI,this_00);
  return;
}

Assistant:

manager::manager() : d(new manager::_data()) 
{
}